

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_dec_integer<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  bool bVar1;
  undefined1 uVar2;
  char_type_conflict cVar3;
  basic_value<toml::type_config> *this;
  source_location *src_00;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  loc_00;
  iterator this_00;
  value_type *pvVar4;
  context<toml::type_config> *in_RDX;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_RDI;
  string sfx;
  region sfx_reg;
  result<long,_toml::error_info> val;
  source_location src;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_underscore;
  integer_format_info fmt;
  string str;
  region reg;
  spec *spec;
  location first;
  region *in_stack_fffffffffffff4c8;
  result<toml::basic_value<toml::type_config>,_toml::error_info> *in_stack_fffffffffffff4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff4e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  __const_iterator in_stack_fffffffffffff4e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffff4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4f8;
  __const_iterator in_stack_fffffffffffff500;
  __const_iterator in_stack_fffffffffffff508;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  region *in_stack_fffffffffffff528;
  region *in_stack_fffffffffffff540;
  region *r;
  undefined7 in_stack_fffffffffffff550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  integer_format_info *fmt_00;
  undefined1 *x;
  uint8_t base;
  string *in_stack_fffffffffffff588;
  basic_value<toml::type_config> *in_stack_fffffffffffff5b8;
  location *in_stack_fffffffffffff5c0;
  sequence *in_stack_fffffffffffff5c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_9e8 [2];
  spec *in_stack_fffffffffffff658;
  string *in_stack_fffffffffffff688;
  source_location *in_stack_fffffffffffff690;
  string *in_stack_fffffffffffff698;
  string *in_stack_fffffffffffff720;
  location *in_stack_fffffffffffff728;
  sequence *in_stack_fffffffffffff730;
  string *in_stack_fffffffffffff738;
  allocator<char> local_7c1 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b9 [17];
  result<long,_toml::error_info> local_490 [3];
  char *local_350;
  char *local_348;
  undefined1 local_331;
  char *local_330;
  char *local_328;
  char *local_320;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310 [2];
  undefined1 local_300 [32];
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0 [2];
  char *local_2d0;
  char *local_2c8;
  undefined1 local_2c0;
  size_t local_2b8;
  region *local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  uint local_268;
  allocator<char> local_261 [144];
  allocator<char> local_1d1 [361];
  spec *local_68;
  context<toml::type_config> *local_18;
  
  local_18 = in_RDX;
  location::location((location *)in_stack_fffffffffffff4f0._M_current,
                     (location *)in_stack_fffffffffffff4e8._M_current);
  local_68 = context<toml::type_config>::toml_spec(local_18);
  syntax::dec_int(in_stack_fffffffffffff658);
  sequence::scan(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  sequence::~sequence((sequence *)in_stack_fffffffffffff4d0);
  bVar1 = region::is_ok((region *)0x67796c);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508._M_current,
               (allocator<char> *)in_stack_fffffffffffff500._M_current);
    syntax::dec_int(in_stack_fffffffffffff658);
    location::location((location *)in_stack_fffffffffffff4f0._M_current,
                       (location *)in_stack_fffffffffffff4e8._M_current);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff510,in_stack_fffffffffffff508._M_current,
               (allocator<char> *)in_stack_fffffffffffff500._M_current);
    make_syntax_error<toml::detail::sequence>
              (in_stack_fffffffffffff738,in_stack_fffffffffffff730,in_stack_fffffffffffff728,
               in_stack_fffffffffffff720);
    err<toml::error_info>((error_info *)in_stack_fffffffffffff528);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff4d0,(failure_type *)in_stack_fffffffffffff4c8);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x677a78);
    error_info::~error_info((error_info *)in_stack_fffffffffffff4d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff4d0);
    std::allocator<char>::~allocator(local_261);
    location::~location((location *)in_stack_fffffffffffff4d0);
    sequence::~sequence((sequence *)in_stack_fffffffffffff4d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff4d0);
    std::allocator<char>::~allocator(local_1d1);
    local_268 = 1;
    goto LAB_006786d8;
  }
  region::as_string_abi_cxx11_(in_stack_fffffffffffff528);
  integer_format_info::integer_format_info
            ((integer_format_info *)in_stack_fffffffffffff4f0._M_current);
  local_2c0 = 0;
  pbVar5 = &local_288;
  this = (basic_value<toml::type_config> *)
         CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                   (pbVar5);
  base = (uint8_t)((ulong)pbVar5 >> 0x38);
  local_2c8 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4c8);
  local_2d0 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                (in_stack_fffffffffffff4d8);
  local_2e0[1].current._M_current._7_1_ = '_';
  src_00 = (source_location *)
           std::count<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                     (in_stack_fffffffffffff4f0,
                      (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )in_stack_fffffffffffff4e8._M_current,in_stack_fffffffffffff4e0._M_current);
  local_2b8 = (long)this - (long)src_00;
  fmt_00 = (integer_format_info *)(local_300 + 0x18);
  pbVar5 = &local_288;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
            (in_stack_fffffffffffff4d8);
  x = local_300 + 0x10;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
            (in_stack_fffffffffffff4d8);
  local_300[0xf] = 0x5f;
  std::find<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,char>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff508._M_current,
             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff500._M_current,(char *)in_stack_fffffffffffff4f8);
  r = (region *)local_300;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rend
            (in_stack_fffffffffffff4d8);
  uVar2 = std::
          operator==<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff4e0._M_current,
                     (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)in_stack_fffffffffffff4d8);
  if (((uVar2 ^ 0xff) & 1) != 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rbegin
              (in_stack_fffffffffffff4d8);
    CLI::std::
    reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reverse_iterator(local_310,local_2e0);
    in_stack_fffffffffffff540 =
         (region *)
         std::
         distance<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>>
                   ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff4f0._M_current,
                    (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff4e8._M_current);
    local_2b0 = in_stack_fffffffffffff540;
  }
  local_328 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)in_stack_fffffffffffff4c8);
  local_330 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                (in_stack_fffffffffffff4d8);
  local_331 = 0x5f;
  loc_00 = std::remove<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                     (in_stack_fffffffffffff4e8._M_current,in_stack_fffffffffffff4e0,
                      (char *)in_stack_fffffffffffff4d8);
  local_320 = loc_00._M_current;
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff4d0,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff4c8);
  local_348 = (char *)CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                (in_stack_fffffffffffff4d8);
  __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
            ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff4d0,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_fffffffffffff4c8);
  this_00 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            erase(in_stack_fffffffffffff4f8,in_stack_fffffffffffff508,in_stack_fffffffffffff500);
  local_350 = this_00._M_current;
  region::region(in_stack_fffffffffffff540,(location *)loc_00._M_current);
  source_location::source_location((source_location *)CONCAT17(uVar2,in_stack_fffffffffffff550),r);
  region::~region((region *)in_stack_fffffffffffff4d0);
  source_location::source_location
            ((source_location *)in_stack_fffffffffffff4f0._M_current,
             (source_location *)in_stack_fffffffffffff4e8._M_current);
  type_config::parse_int(in_stack_fffffffffffff588,src_00,base);
  source_location::~source_location((source_location *)in_stack_fffffffffffff4d0);
  bVar1 = result<long,_toml::error_info>::is_err(local_490);
  if (bVar1) {
    location::operator=((location *)in_stack_fffffffffffff4d0,(location *)in_stack_fffffffffffff4c8)
    ;
    result<long,_toml::error_info>::as_err((result<long,_toml::error_info> *)0x677fcd);
    err<toml::error_info_const&>((error_info *)this_00._M_current);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff4d0,(failure_type *)in_stack_fffffffffffff4c8);
    failure<toml::error_info>::~failure((failure<toml::error_info> *)0x678003);
    local_268 = 1;
  }
  else {
    if (((local_68->ext_num_suffix & 1U) != 0) &&
       (cVar3 = location::current((location *)in_stack_fffffffffffff4c8), cVar3 == '_')) {
      syntax::num_suffix((spec *)in_stack_fffffffffffff5c8);
      sequence::scan(in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
      sequence::~sequence((sequence *)in_stack_fffffffffffff4d0);
      bVar1 = region::is_ok((region *)0x67813c);
      if (bVar1) {
        region::as_string_abi_cxx11_((region *)this_00._M_current);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4c8);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff4d0,
                   (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff4c8);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4e0._M_current,in_stack_fffffffffffff4e8);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffff4d0,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  in_stack_fffffffffffff4c8);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4d0);
      }
      else {
        location::operator=((location *)in_stack_fffffffffffff4d0,
                            (location *)in_stack_fffffffffffff4c8);
        this_02 = local_6b9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_02,in_stack_fffffffffffff508._M_current,
                   (allocator<char> *)in_stack_fffffffffffff500._M_current);
        region::region(in_stack_fffffffffffff540,(location *)loc_00._M_current);
        source_location::source_location
                  ((source_location *)CONCAT17(uVar2,in_stack_fffffffffffff550),r);
        __s = local_7c1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (this_02,(char *)__s,(allocator<char> *)in_stack_fffffffffffff500._M_current);
        make_error_info<>(in_stack_fffffffffffff698,in_stack_fffffffffffff690,
                          in_stack_fffffffffffff688);
        err<toml::error_info>((error_info *)this_00._M_current);
        result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                  (in_stack_fffffffffffff4d0,(failure_type *)in_stack_fffffffffffff4c8);
        failure<toml::error_info>::~failure((failure<toml::error_info> *)0x678245);
        error_info::~error_info((error_info *)in_stack_fffffffffffff4d0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4d0);
        std::allocator<char>::~allocator(local_7c1);
        source_location::~source_location((source_location *)in_stack_fffffffffffff4d0);
        region::~region((region *)in_stack_fffffffffffff4d0);
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff4d0);
        std::allocator<char>::~allocator((allocator<char> *)local_6b9);
      }
      local_268 = (uint)!bVar1;
      region::~region((region *)in_stack_fffffffffffff4d0);
      if (local_268 != 0) goto LAB_0067866c;
    }
    pvVar4 = result<long,_toml::error_info>::as_ok((result<long,_toml::error_info> *)0x6784e2);
    in_stack_fffffffffffff4d0 =
         (result<toml::basic_value<toml::type_config>,_toml::error_info> *)*pvVar4;
    integer_format_info::integer_format_info
              ((integer_format_info *)in_stack_fffffffffffff4d0,
               (integer_format_info *)in_stack_fffffffffffff4c8);
    local_9e8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_9e8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_9e8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_01 = local_9e8;
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)0x67852d);
    region::region((region *)in_stack_fffffffffffff4d0,in_stack_fffffffffffff4c8);
    basic_value<toml::type_config>::basic_value
              (this,(integer_type)x,fmt_00,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)pbVar5,(region_type *)CONCAT17(uVar2,in_stack_fffffffffffff550));
    ok<toml::basic_value<toml::type_config>>(in_stack_fffffffffffff5b8);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (in_stack_fffffffffffff4d0,(success_type *)in_stack_fffffffffffff4c8);
    success<toml::basic_value<toml::type_config>_>::~success
              ((success<toml::basic_value<toml::type_config>_> *)0x6785a5);
    basic_value<toml::type_config>::~basic_value
              ((basic_value<toml::type_config> *)in_stack_fffffffffffff4d0);
    region::~region((region *)in_stack_fffffffffffff4d0);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this_01);
    integer_format_info::~integer_format_info((integer_format_info *)0x6785d9);
    local_268 = 1;
  }
LAB_0067866c:
  result<long,_toml::error_info>::~result((result<long,_toml::error_info> *)0x678679);
  source_location::~source_location((source_location *)in_stack_fffffffffffff4d0);
  integer_format_info::~integer_format_info((integer_format_info *)0x678693);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff4d0);
LAB_006786d8:
  region::~region((region *)in_stack_fffffffffffff4d0);
  location::~location((location *)in_stack_fffffffffffff4d0);
  return in_RDI;
}

Assistant:

result<basic_value<TC>, error_info>
parse_dec_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::dec_int(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_dec_integer: "
            "invalid integer: dec_int must be like: 42, 123_456_789",
            syntax::dec_int(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    auto str = reg.as_string();

    integer_format_info fmt;
    fmt.fmt = integer_format::dec;
    fmt.width = str.size() - static_cast<std::size_t>(std::count(str.begin(), str.end(), '_'));

    const auto first_underscore = std::find(str.rbegin(), str.rend(), '_');
    if(first_underscore != str.rend())
    {
        fmt.spacer = static_cast<std::size_t>(std::distance(str.rbegin(), first_underscore));
    }

    // remove all `_` before calling TC::parse_int
    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    auto src = source_location(region(loc));
    const auto val = TC::parse_int(str, src, 10);
    if(val.is_err())
    {
        loc = first;
        return err(val.as_err());
    }

    // ----------------------------------------------------------------------
    // parse suffix (extension)

    if(spec.ext_num_suffix && loc.current() == '_')
    {
        const auto sfx_reg = syntax::num_suffix(spec).scan(loc);
        if( ! sfx_reg.is_ok())
        {
            loc = first;
            return err(make_error_info("toml::parse_dec_integer: "
                "invalid suffix: should be `_ non-digit-graph (graph | _graph)`",
                source_location(region(loc)), "here"));
        }
        auto sfx = sfx_reg.as_string();
        assert( ! sfx.empty() && sfx.front() == '_');
        sfx.erase(sfx.begin()); // remove the first `_`

        fmt.suffix = sfx;
    }

    return ok(basic_value<TC>(val.as_ok(), std::move(fmt), {}, std::move(reg)));
}